

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

bool EvaluateToBuffer(ExpressionEvalContext *ctx,ExprBase *expression,char *resultBuf,
                     uint resultBufSize)

{
  ExprBase *node;
  ExprBoolLiteral *pEVar1;
  ExprCharacterLiteral *pEVar2;
  ExprIntegerLiteral *pEVar3;
  ExprRationalLiteral *pEVar4;
  ExprRationalLiteral *result_3;
  ExprIntegerLiteral *result_2;
  ExprCharacterLiteral *result_1;
  ExprBoolLiteral *result;
  ExprBase *value;
  uint resultBufSize_local;
  char *resultBuf_local;
  ExprBase *expression_local;
  ExpressionEvalContext *ctx_local;
  
  node = Evaluate(ctx,expression);
  if (node == (ExprBase *)0x0) {
    ctx_local._7_1_ = false;
  }
  else {
    pEVar1 = getType<ExprBoolLiteral>(node);
    if (pEVar1 == (ExprBoolLiteral *)0x0) {
      pEVar2 = getType<ExprCharacterLiteral>(node);
      if (pEVar2 == (ExprCharacterLiteral *)0x0) {
        pEVar3 = getType<ExprIntegerLiteral>(node);
        if (pEVar3 == (ExprIntegerLiteral *)0x0) {
          pEVar4 = getType<ExprRationalLiteral>(node);
          if (pEVar4 == (ExprRationalLiteral *)0x0) {
            NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"unknown");
          }
          else {
            NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%f",pEVar4->value);
          }
        }
        else if ((pEVar3->super_ExprBase).type == ctx->ctx->typeLong) {
          NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%lldL",pEVar3->value);
        }
        else {
          NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%d",pEVar3->value & 0xffffffff);
        }
      }
      else {
        NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%d",
                           (ulong)(uint)(int)(char)(pEVar2->super_ExprBase).field_0x29);
      }
    }
    else {
      NULLC::SafeSprintf(resultBuf,(ulong)resultBufSize,"%d",
                         (ulong)(((pEVar1->super_ExprBase).field_0x29 & 1) != 0));
    }
    ctx_local._7_1_ = true;
  }
  return ctx_local._7_1_;
}

Assistant:

bool EvaluateToBuffer(ExpressionEvalContext &ctx, ExprBase *expression, char *resultBuf, unsigned resultBufSize)
{
	if(ExprBase *value = Evaluate(ctx, expression))
	{
		if(ExprBoolLiteral *result = getType<ExprBoolLiteral>(value))
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%d", result->value ? 1 : 0);
		}
		else if(ExprCharacterLiteral *result = getType<ExprCharacterLiteral>(value))
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%d", result->value);
		}
		else if(ExprIntegerLiteral *result = getType<ExprIntegerLiteral>(value))
		{
			if(result->type == ctx.ctx.typeLong)
				NULLC::SafeSprintf(resultBuf, resultBufSize, "%lldL", result->value);
			else
				NULLC::SafeSprintf(resultBuf, resultBufSize, "%d", int(result->value));
		}
		else if(ExprRationalLiteral *result = getType<ExprRationalLiteral>(value))
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "%f", result->value);
		}
		else
		{
			NULLC::SafeSprintf(resultBuf, resultBufSize, "unknown");
		}

		return true;
	}

	return false;
}